

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O2

void __thiscall string_from_float_Test::~string_from_float_Test(string_from_float_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(string, from_float)
{
    EXPECT_EQ(ST_LITERAL("0"), ST::string::from_float(0.0f));
    EXPECT_EQ(ST_LITERAL("0"), ST::string::from_double(0.0));

    EXPECT_EQ(ST_LITERAL("-16"), ST::string::from_float(-16.0f));
    EXPECT_EQ(ST_LITERAL("16"), ST::string::from_float(16.0f));
    EXPECT_EQ(ST_LITERAL("1.6"), ST::string::from_float(1.6f));
    EXPECT_EQ(ST_LITERAL("16384.5"), ST::string::from_float(16384.5f));
    EXPECT_EQ(ST_LITERAL("0.0078"), ST::string::from_float(0.0078f));

    EXPECT_EQ(ST_LITERAL("-16"), ST::string::from_double(-16.0));
    EXPECT_EQ(ST_LITERAL("16"), ST::string::from_double(16.0));
    EXPECT_EQ(ST_LITERAL("1.6"), ST::string::from_double(1.6));
    EXPECT_EQ(ST_LITERAL("16384.5"), ST::string::from_double(16384.5));
    EXPECT_EQ(ST_LITERAL("0.0078"), ST::string::from_double(0.0078));

    // Special values (Different CRTs have very different ways of representing
    // infinity and NaN textually :( )
    EXPECT_TRUE(ST::string::from_float(std::numeric_limits<float>::infinity())
                .find("inf", ST::case_insensitive) >= 0);
    EXPECT_TRUE(ST::string::from_double(std::numeric_limits<double>::infinity())
                .find("inf", ST::case_insensitive) >= 0);
    EXPECT_TRUE(ST::string::from_float(std::numeric_limits<float>::quiet_NaN())
                .find("nan", ST::case_insensitive) >= 0);
    EXPECT_TRUE(ST::string::from_double(std::numeric_limits<float>::quiet_NaN())
                .find("nan", ST::case_insensitive) >= 0);
}